

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O1

int fits_rcomp_short(short *a,int nx,uchar *c,int clen,int nblock)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  void *__ptr;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  Buffer *buffer;
  uint uVar10;
  uchar *__s;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  short sVar15;
  short sVar16;
  Buffer_t *pBVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  Buffer bufmem;
  Buffer local_a8;
  uint local_88;
  uint local_84;
  long local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  void *local_58;
  ulong local_50;
  long local_48;
  short *local_40;
  ulong local_38;
  
  uVar12 = (ulong)(uint)nx;
  local_a8.end = c + clen;
  local_a8.bits_to_go = 8;
  local_80 = (long)nblock;
  local_a8.start = c;
  local_a8.current = c;
  __ptr = malloc(local_80 * 4);
  if (__ptr == (void *)0x0) {
    ffpmsg("fits_rcomp: insufficient memory");
LAB_001b712d:
    local_a8.current._0_4_ = -1;
  }
  else {
    local_a8.bitbuffer = 0;
    local_a8.bits_to_go = 8;
    output_nbits(&local_a8,(int)*a,0x10);
    if (0 < nx) {
      sVar15 = *a;
      local_60 = local_80 * 2;
      lVar11 = 0;
      local_70 = (ulong)(uint)nblock;
      local_68 = uVar12;
      local_58 = __ptr;
      do {
        uVar9 = uVar12 - lVar11;
        if (local_80 <= (long)(uVar12 - lVar11)) {
          uVar9 = local_70;
        }
        uVar8 = uVar9 & 0xffffffff;
        iVar6 = (int)uVar9;
        if (iVar6 < 1) {
          dVar18 = 0.0;
        }
        else {
          dVar18 = 0.0;
          uVar4 = 0;
          sVar16 = sVar15;
          do {
            sVar15 = a[uVar4];
            uVar5 = (int)(short)(sVar15 - sVar16) >> 0xf ^ (short)(sVar15 - sVar16) * 2;
            *(uint *)((long)__ptr + uVar4 * 4) = uVar5;
            dVar18 = dVar18 + (double)(int)uVar5;
            uVar4 = uVar4 + 1;
            sVar16 = sVar15;
          } while ((uVar9 & 0xffffffff) != uVar4);
        }
        dVar20 = ((dVar18 - (double)((int)(((uint)(uVar9 >> 0x1f) & 1) + iVar6) >> 1)) + -1.0) /
                 (double)iVar6;
        dVar19 = 0.0;
        if (0.0 <= dVar20) {
          dVar19 = dVar20;
        }
        uVar9 = 0;
        uVar3 = (ushort)(int)dVar19;
        if (1 < uVar3) {
          uVar2 = 0xf;
          if (uVar3 != 0) {
            for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          uVar9 = (ulong)uVar2;
        }
        uVar5 = (uint)uVar9;
        local_70 = uVar8;
        local_48 = lVar11;
        local_40 = a;
        if (uVar5 < 0xe) {
          if (((uVar5 != 0) || (dVar18 != 0.0)) || (NAN(dVar18))) {
            local_78 = uVar9;
            output_nbits(&local_a8,uVar5 + 1,4);
            pBVar17 = local_a8.current;
            uVar5 = local_a8.bitbuffer;
            iVar7 = local_a8.bits_to_go;
            if (0 < iVar6) {
              uVar13 = ~(-1 << ((byte)local_78 & 0x1f));
              uVar9 = 0;
              uVar12 = local_78;
              local_88 = uVar13;
              local_50 = uVar8;
              do {
                uVar10 = *(uint *)((long)__ptr + uVar9 * 4);
                iVar14 = (int)uVar10 >> ((byte)uVar12 & 0x1f);
                iVar6 = iVar14 - iVar7;
                if (iVar14 < iVar7) {
                  uVar5 = uVar5 << ((byte)(iVar14 + 1) & 0x1f) | 1;
                  iVar6 = iVar7 - (iVar14 + 1);
                }
                else {
                  __s = pBVar17 + 1;
                  *pBVar17 = (uchar)(uVar5 << ((byte)iVar7 & 0x1f));
                  if (7 < iVar6) {
                    if (0xe < iVar6) {
                      iVar6 = 0xf;
                    }
                    uVar13 = (iVar14 - (iVar6 + iVar7)) + 7;
                    uVar5 = uVar13 >> 3;
                    local_38 = (ulong)uVar5;
                    local_84 = uVar10;
                    memset(__s,0,(ulong)(uVar5 + 1));
                    __s = pBVar17 + local_38 + 2;
                    iVar6 = (iVar14 - ((uVar13 & 0xfffffff8) + iVar7)) + -8;
                    uVar12 = local_78;
                    uVar8 = local_50;
                    __ptr = local_58;
                    uVar13 = local_88;
                    uVar10 = local_84;
                  }
                  iVar6 = 7 - iVar6;
                  uVar5 = 1;
                  pBVar17 = __s;
                }
                iVar14 = (int)uVar12;
                iVar7 = iVar6;
                if (iVar14 != 0) {
                  uVar5 = uVar10 & uVar13 | uVar5 << ((byte)uVar12 & 0x1f);
                  iVar7 = iVar6 - iVar14;
                  if (iVar7 == 0 || iVar6 < iVar14) {
                    iVar14 = iVar14 - iVar6;
                    iVar6 = iVar7;
                    do {
                      *pBVar17 = (uchar)((int)uVar5 >> ((byte)iVar14 & 0x1f));
                      pBVar17 = pBVar17 + 1;
                      iVar7 = iVar6 + 8;
                      iVar14 = iVar14 + -8;
                      bVar1 = iVar6 < -7;
                      iVar6 = iVar7;
                    } while (bVar1);
                  }
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 != uVar8);
            }
            local_a8.current = pBVar17;
            if (local_a8.end < pBVar17) {
              ffpmsg("rice_encode: end of buffer");
              free(__ptr);
              goto LAB_001b712d;
            }
            local_a8.bits_to_go = iVar7;
            local_a8.bitbuffer = uVar5;
            uVar12 = local_68;
          }
          else {
            output_nbits(&local_a8,0,4);
          }
        }
        else {
          output_nbits(&local_a8,0xf,4);
          if (0 < iVar6) {
            uVar9 = local_70 & 0xffffffff;
            uVar8 = 0;
            do {
              output_nbits(&local_a8,*(int *)((long)__ptr + uVar8 * 4),0x10);
              uVar8 = uVar8 + 1;
            } while (uVar9 != uVar8);
          }
        }
        lVar11 = local_48 + local_80;
        a = (short *)((long)local_40 + local_60);
      } while (lVar11 < (long)uVar12);
    }
    if (local_a8.bits_to_go < 8) {
      *local_a8.current = (uchar)(local_a8.bitbuffer << ((byte)local_a8.bits_to_go & 0x1f));
      local_a8.current = local_a8.current + 1;
    }
    free(__ptr);
    local_a8.current._0_4_ = (int)local_a8.current - (int)local_a8.start;
  }
  return (int)local_a8.current;
}

Assistant:

int fits_rcomp_short(
	  short a[],		/* input array			*/
	  int nx,		/* number of input pixels	*/
	  unsigned char *c,	/* output buffer		*/
	  int clen,		/* max length of output		*/
	  int nblock)		/* coding block size		*/
{
Buffer bufmem, *buffer = &bufmem;
/* int bsize;  */
int i, j, thisblock;

/* 
NOTE: in principle, the following 2 variable could be declared as 'short'
but in fact the code runs faster (on 32-bit Linux at least) as 'int'
*/
int lastpix, nextpix;
/* int pdiff; */
short pdiff; 
int v, fs, fsmask, top, fsmax, fsbits, bbits;
int lbitbuffer, lbits_to_go;
/* unsigned int psum; */
unsigned short psum;
double pixelsum, dpsum;
unsigned int *diff;

    /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 2; */

/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return(-1);
    }
*/

    /* move these out of switch block to further tweak performance */
    fsbits = 4;
    fsmax = 14;
    
    bbits = 1<<fsbits;

    /*
     * Set up buffer pointers
     */
    buffer->start = c;
    buffer->current = c;
    buffer->end = c+clen;
    buffer->bits_to_go = 8;
    /*
     * array for differences mapped to non-negative values
     */
    diff = (unsigned int *) malloc(nblock*sizeof(unsigned int));
    if (diff == (unsigned int *) NULL) {
        ffpmsg("fits_rcomp: insufficient memory");
	return(-1);
    }
    /*
     * Code in blocks of nblock pixels
     */
    start_outputing_bits(buffer);

    /* write out first short value to the first 2 bytes of the buffer */
    if (output_nbits(buffer, a[0], 16) == EOF) {
        ffpmsg("rice_encode: end of buffer");
        free(diff);
        return(-1);
    }

    lastpix = a[0];  /* the first difference will always be zero */

    thisblock = nblock;
    for (i=0; i<nx; i += nblock) {
	/* last block may be shorter */
	if (nx-i < nblock) thisblock = nx-i;
	/*
	 * Compute differences of adjacent pixels and map them to unsigned values.
	 * Note that this may overflow the integer variables -- that's
	 * OK, because we can recover when decompressing.  If we were
	 * compressing shorts or bytes, would want to do this arithmetic
	 * with short/byte working variables (though diff will still be
	 * passed as an int.)
	 *
	 * compute sum of mapped pixel values at same time
	 * use double precision for sum to allow 32-bit integer inputs
	 */
	pixelsum = 0.0;
	for (j=0; j<thisblock; j++) {
	    nextpix = a[i+j];
	    pdiff = nextpix - lastpix;
	    diff[j] = (unsigned int) ((pdiff<0) ? ~(pdiff<<1) : (pdiff<<1));
	    pixelsum += diff[j];
	    lastpix = nextpix;
	}
	/*
	 * compute number of bits to split from sum
	 */
	dpsum = (pixelsum - (thisblock/2) - 1)/thisblock;
	if (dpsum < 0) dpsum = 0.0;
/*	psum = ((unsigned int) dpsum ) >> 1; */
	psum = ((unsigned short) dpsum ) >> 1;
	for (fs = 0; psum>0; fs++) psum >>= 1;

	/*
	 * write the codes
	 * fsbits ID bits used to indicate split level
	 */
	if (fs >= fsmax) {
/* case3++; */
	    /* Special high entropy case when FS >= fsmax
	     * Just write pixel difference values directly, no Rice coding at all.
	     */
	    if (output_nbits(buffer, fsmax+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    for (j=0; j<thisblock; j++) {
		if (output_nbits(buffer, diff[j], bbits) == EOF) {
                    ffpmsg("rice_encode: end of buffer");
                    free(diff);
		    return(-1);
		}
	    }
	} else if (fs == 0 && pixelsum == 0) {
/* case1++; */
	    /*
	     * special low entropy case when FS = 0 and pixelsum=0 (all
	     * pixels in block are zero.)
	     * Output a 0 and return
	     */
	    if (output_nbits(buffer, 0, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	} else {
/* case2++; */
	    /* normal case: not either very high or very low entropy */
	    if (output_nbits(buffer, fs+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    fsmask = (1<<fs) - 1;
	    /*
	     * local copies of bit buffer to improve optimization
	     */
	    lbitbuffer = buffer->bitbuffer;
	    lbits_to_go = buffer->bits_to_go;
	    for (j=0; j<thisblock; j++) {
		v = diff[j];
		top = v >> fs;
		/*
		 * top is coded by top zeros + 1
		 */
		if (lbits_to_go >= top+1) {
		    lbitbuffer <<= top+1;
		    lbitbuffer |= 1;
		    lbits_to_go -= top+1;
		} else {
		    lbitbuffer <<= lbits_to_go;
		    putcbuf(lbitbuffer & 0xff,buffer);
		    for (top -= lbits_to_go; top>=8; top -= 8) {
			putcbuf(0, buffer);
		    }
		    lbitbuffer = 1;
		    lbits_to_go = 7-top;
		}
		/*
		 * bottom FS bits are written without coding
		 * code is output_nbits, moved into this routine to reduce overheads
		 * This code potentially breaks if FS>24, so I am limiting
		 * FS to 24 by choice of FSMAX above.
		 */
		if (fs > 0) {
		    lbitbuffer <<= fs;
		    lbitbuffer |= v & fsmask;
		    lbits_to_go -= fs;
		    while (lbits_to_go <= 0) {
			putcbuf((lbitbuffer>>(-lbits_to_go)) & 0xff,buffer);
			lbits_to_go += 8;
		    }
		}
	    }
	    /* check if overflowed output buffer */
	    if (buffer->current > buffer->end) {
                 ffpmsg("rice_encode: end of buffer");
                 free(diff);
		 return(-1);
	    }
	    buffer->bitbuffer = lbitbuffer;
	    buffer->bits_to_go = lbits_to_go;
	}
    }
    done_outputing_bits(buffer);
    free(diff);
    /*
     * return number of bytes used
     */
    return(buffer->current - buffer->start);
}